

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

bool tinyusdz::is_close(matrix2d *a,matrix2d *b,double eps)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = a->m[0][0];
  dVar3 = b->m[0][0];
  dVar2 = ABS(dVar5 - dVar3);
  if (dVar2 <= eps) {
LAB_003af85f:
    dVar5 = a->m[0][1];
    dVar3 = b->m[0][1];
    dVar2 = ABS(dVar5 - dVar3);
    if (eps < dVar2) {
      dVar5 = ABS(dVar5);
      dVar3 = ABS(dVar3);
      dVar4 = dVar3;
      if (dVar3 <= dVar5) {
        dVar4 = dVar5;
      }
      if ((double)(~-(ulong)NAN(dVar5) & (ulong)dVar4 | -(ulong)NAN(dVar5) & (ulong)dVar3) * eps <
          dVar2) goto LAB_003af90d;
    }
    dVar5 = a->m[1][0];
    dVar3 = b->m[1][0];
    dVar2 = ABS(dVar5 - dVar3);
    if (eps < dVar2) {
      dVar5 = ABS(dVar5);
      dVar3 = ABS(dVar3);
      dVar4 = dVar3;
      if (dVar3 <= dVar5) {
        dVar4 = dVar5;
      }
      if ((double)(~-(ulong)NAN(dVar5) & (ulong)dVar4 | -(ulong)NAN(dVar5) & (ulong)dVar3) * eps <
          dVar2) goto LAB_003af90d;
    }
    dVar5 = a->m[1][1];
    dVar3 = b->m[1][1];
    dVar2 = ABS(dVar5 - dVar3);
    bVar1 = true;
    if (eps < dVar2) {
      dVar5 = ABS(dVar5);
      dVar3 = ABS(dVar3);
      dVar4 = dVar3;
      if (dVar3 <= dVar5) {
        dVar4 = dVar5;
      }
      return dVar2 <= (double)(~-(ulong)NAN(dVar5) & (ulong)dVar4 |
                              -(ulong)NAN(dVar5) & (ulong)dVar3) * eps;
    }
  }
  else {
    dVar5 = ABS(dVar5);
    dVar3 = ABS(dVar3);
    dVar4 = dVar3;
    if (dVar3 <= dVar5) {
      dVar4 = dVar5;
    }
    if (dVar2 <= (double)(~-(ulong)NAN(dVar5) & (ulong)dVar4 | -(ulong)NAN(dVar5) & (ulong)dVar3) *
                 eps) goto LAB_003af85f;
LAB_003af90d:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool is_close(const value::matrix2d &a, const value::matrix2d &b, const double eps) {
  return math::is_close(a.m[0][0], b.m[0][0], eps) &&
         math::is_close(a.m[0][1], b.m[0][1], eps) &&
         math::is_close(a.m[1][0], b.m[1][0], eps) &&
         math::is_close(a.m[1][1], b.m[1][1], eps);
}